

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

bool __thiscall asmjit::CodeCompiler::getSaveOnUnuse(CodeCompiler *this,Reg *reg)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  VirtReg *vreg;
  size_t index;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  undefined1 local_51;
  
  if (*(int *)(in_RSI + 4) - 0x100U < 0xffffff00) {
    if (*(int *)(in_RSI + 4) == -1) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    uVar1 = (ulong)(*(int *)(in_RSI + 4) - 0x100);
    if (*(ulong *)(in_RDI + 0x1c0) <= uVar1) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    if (*(ulong *)(in_RDI + 0x1c0) <= uVar1) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    local_51 = (*(byte *)(*(long *)(*(long *)(in_RDI + 0x1b8) + uVar1 * 8) + 0x17) >> 3 & 1) != 0;
  }
  else {
    local_51 = false;
  }
  return local_51;
}

Assistant:

bool CodeCompiler::getSaveOnUnuse(Reg& reg) const {
  if (!reg.isVirtReg()) return false;

  VirtReg* vreg = getVirtRegById(reg.getId());
  return static_cast<bool>(vreg->_saveOnUnuse);
}